

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Annotation.cpp
# Opt level: O2

void soul::replaceStringLiterals
               (Value *v,SubElementPath *path,StringDictionary *sourceDictionary,
               StringDictionary *destDictionary)

{
  Handle HVar1;
  int iVar2;
  undefined4 extraout_var;
  ArraySize AVar3;
  Structure *pSVar4;
  size_t i;
  ulong uVar5;
  Value value;
  Value local_120;
  Value local_e0;
  ArrayWithPreallocation<unsigned_long,_4UL> local_a0;
  ArrayWithPreallocation<unsigned_long,_4UL> local_68;
  
  Value::getSubElement(&local_120,v,path);
  if (local_120.type.category == stringLiteral) {
    HVar1 = Value::getStringLiteral(&local_120);
    iVar2 = (*(sourceDictionary->super_StringDictionary)._vptr_StringDictionary[3])
                      (sourceDictionary,(ulong)HVar1.handle);
    HVar1.handle = (*(destDictionary->super_StringDictionary)._vptr_StringDictionary[2])
                             (destDictionary,CONCAT44(extraout_var,iVar2));
    Value::createStringLiteral(&local_e0,HVar1);
    Value::modifySubElementInPlace(v,path,&local_e0);
    Value::~Value(&local_e0);
  }
  else if ((local_120.type.category == array) && (local_120.type.boundingSize != 0)) {
    uVar5 = 0;
    while( true ) {
      AVar3 = Type::getArraySize(&local_120.type);
      if (AVar3 <= uVar5) break;
      SubElementPath::operator+((SubElementPath *)&local_68,path,uVar5);
      replaceStringLiterals(v,(SubElementPath *)&local_68,sourceDictionary,destDictionary);
      ArrayWithPreallocation<unsigned_long,_4UL>::clear(&local_68);
      uVar5 = uVar5 + 1;
    }
  }
  else if (local_120.type.category == structure) {
    uVar5 = 0;
    while( true ) {
      pSVar4 = Type::getStructRef(&local_120.type);
      if ((pSVar4->members).numActive <= uVar5) break;
      SubElementPath::operator+((SubElementPath *)&local_a0,path,uVar5);
      replaceStringLiterals(v,(SubElementPath *)&local_a0,sourceDictionary,destDictionary);
      ArrayWithPreallocation<unsigned_long,_4UL>::clear(&local_a0);
      uVar5 = uVar5 + 1;
    }
  }
  Value::~Value(&local_120);
  return;
}

Assistant:

static void replaceStringLiterals (Value& v, SubElementPath path, const StringDictionary& sourceDictionary, StringDictionary& destDictionary)
{
    auto value = v.getSubElement (path);

    if (value.getType().isStringLiteral())
    {
        auto s = sourceDictionary.getStringForHandle (value.getStringLiteral());
        v.modifySubElementInPlace (path, Value::createStringLiteral (destDictionary.getHandleForString (s)));
    }
    else if (value.getType().isFixedSizeArray())
    {
        for (size_t i = 0; i < value.getType().getArraySize(); ++i)
             replaceStringLiterals (v, path + i, sourceDictionary, destDictionary);
    }
    else if (value.getType().isStruct())
    {
        for (size_t i = 0; i < value.getType().getStructRef().getNumMembers(); ++i)
             replaceStringLiterals (v, path + i, sourceDictionary, destDictionary);
    }
}